

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte bVar1;
  ushort uVar2;
  mz_uint mVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  uint uVar15;
  void *__s2;
  ulong __n;
  byte bVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  int iVar20;
  ulong uVar21;
  byte *pbVar22;
  byte bVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  bool bVar27;
  int local_7c;
  
  iVar12 = -1;
  iVar7 = iVar12;
  if (((pZip != (mz_zip_archive *)0x0) &&
      (pmVar4 = pZip->m_pState, pName != (char *)0x0 && pmVar4 != (mz_zip_internal_state *)0x0)) &&
     (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) {
    if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
       ((pmVar4->m_sorted_central_dir_offsets).m_size != 0)) {
      pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
      mVar3 = pZip->m_total_files;
      sVar8 = strlen(pName);
      iVar25 = mVar3 - 1;
      iVar12 = 0;
      uVar9 = 0xffffffff;
      do {
        if (iVar25 < iVar12) {
          return -1;
        }
        uVar15 = (uint)(iVar12 + iVar25) >> 1;
        uVar24 = (ulong)*(uint *)((long)pvVar5 + (ulong)uVar15 * 4);
        pvVar6 = (pmVar4->m_central_dir).m_p;
        uVar11 = (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + uVar24 * 4);
        pbVar18 = (byte *)((long)pvVar6 + uVar11 + 0x2e);
        uVar2 = *(ushort *)((long)pvVar6 + uVar11 + 0x1c);
        uVar21 = (ulong)uVar2;
        if ((uint)sVar8 <= (uint)uVar2) {
          uVar21 = sVar8 & 0xffffffff;
        }
        pbVar19 = (byte *)((long)pvVar6 + uVar21 + uVar11 + 0x2e);
        pbVar22 = (byte *)pName;
        if ((int)uVar21 == 0) {
          iVar20 = 0;
        }
        else {
          do {
            bVar1 = *pbVar18;
            bVar23 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar23 = bVar1;
            }
            bVar1 = *pbVar22;
            bVar16 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar16 = bVar1;
            }
            if (bVar23 != bVar16) break;
            pbVar18 = pbVar18 + 1;
            pbVar22 = pbVar22 + 1;
          } while (pbVar18 < pbVar19);
          iVar20 = (uint)bVar23 - (uint)bVar16;
        }
        if (pbVar18 == pbVar19) {
          iVar20 = (uint)uVar2 - (uint)sVar8;
        }
        iVar7 = iVar25;
        if (iVar20 != 0) {
          uVar24 = uVar9;
          iVar7 = uVar15 - 1;
          if (iVar20 < 0) {
            iVar12 = uVar15 + 1;
            iVar7 = iVar25;
          }
        }
        iVar25 = iVar7;
        iVar7 = (int)uVar24;
        uVar9 = uVar24;
      } while (iVar20 != 0);
    }
    else {
      sVar8 = strlen(pName);
      if (sVar8 < 0x10000) {
        if (pComment == (char *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = strlen(pComment);
        }
        if ((uVar9 < 0x10000) && (uVar15 = pZip->m_total_files, (ulong)uVar15 != 0)) {
          pvVar5 = (pmVar4->m_central_dir).m_p;
          pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
          uVar24 = 0;
          do {
            uVar21 = (ulong)*(uint *)((long)pvVar6 + uVar24 * 4);
            uVar2 = *(ushort *)((long)pvVar5 + uVar21 + 0x1c);
            uVar11 = (ulong)uVar2;
            bVar27 = false;
            if (sVar8 <= uVar11) {
              __s2 = (void *)((long)pvVar5 + uVar21 + 0x2e);
              if (uVar9 != 0) {
                __n = (ulong)*(ushort *)((long)pvVar5 + uVar21 + 0x20);
                if (uVar9 == __n) {
                  uVar17 = (ulong)*(ushort *)((long)pvVar5 + uVar21 + 0x1e);
                  if ((flags >> 8 & 1) == 0) {
                    if (__n == 0) {
                      bVar26 = false;
                    }
                    else {
                      lVar10 = 0;
                      do {
                        bVar1 = pComment[lVar10];
                        iVar7 = bVar1 + 0x20;
                        if (0x19 < (byte)(bVar1 + 0xbf)) {
                          iVar7 = (int)(char)bVar1;
                        }
                        bVar1 = *(byte *)((long)pvVar5 + lVar10 + uVar17 + uVar21 + uVar11 + 0x2e);
                        iVar25 = bVar1 + 0x20;
                        if (0x19 < (byte)(bVar1 + 0xbf)) {
                          iVar25 = (int)(char)bVar1;
                        }
                        bVar26 = iVar7 != iVar25;
                      } while ((!bVar26) &&
                              (bVar27 = __n - 1 != lVar10, lVar10 = lVar10 + 1, bVar27));
                    }
                  }
                  else {
                    iVar7 = bcmp(pComment,(void *)((long)__s2 + uVar17 + uVar11),__n);
                    bVar26 = iVar7 != 0;
                  }
                  bVar26 = (bool)(bVar26 ^ 1);
                }
                else {
                  bVar26 = false;
                }
                bVar27 = false;
                if (!bVar26) goto LAB_001334f4;
              }
              if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
                do {
                  uVar13 = *(byte *)((long)pvVar5 + uVar11 + uVar21 + 0x2d) - 0x2f;
                  if ((uVar13 < 0x2e) && ((0x200000000801U >> ((ulong)uVar13 & 0x3f) & 1) != 0))
                  goto LAB_00133443;
                  bVar27 = 1 < (long)uVar11;
                  uVar11 = uVar11 - 1;
                } while (bVar27);
                uVar11 = 0;
LAB_00133443:
                __s2 = (void *)((long)__s2 + (uVar11 & 0xffffffff));
                uVar11 = (ulong)((uint)uVar2 - (int)uVar11);
              }
              if (sVar8 == uVar11) {
                if ((flags >> 8 & 1) == 0) {
                  if (uVar11 != 0) {
                    sVar14 = 0;
                    do {
                      bVar1 = pName[sVar14];
                      iVar7 = bVar1 + 0x20;
                      if (0x19 < (byte)(bVar1 + 0xbf)) {
                        iVar7 = (int)(char)bVar1;
                      }
                      bVar1 = *(byte *)((long)__s2 + sVar14);
                      iVar25 = bVar1 + 0x20;
                      if (0x19 < (byte)(bVar1 + 0xbf)) {
                        iVar25 = (int)(char)bVar1;
                      }
                      if (iVar7 != iVar25) goto LAB_001334d2;
                      sVar14 = sVar14 + 1;
                    } while (uVar11 != sVar14);
                  }
                }
                else {
                  iVar7 = bcmp(pName,__s2,uVar11);
                  if (iVar7 != 0) goto LAB_001334d2;
                }
                bVar27 = true;
                local_7c = (int)uVar24;
              }
              else {
LAB_001334d2:
                bVar27 = false;
              }
            }
LAB_001334f4:
            iVar7 = local_7c;
          } while ((!bVar27) && (uVar24 = uVar24 + 1, iVar7 = iVar12, uVar24 != uVar15));
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags)
{
  mz_uint file_index; size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName); if (name_len > 0xFFFF) return -1;
  comment_len = pComment ? strlen(pComment) : 0; if (comment_len > 0xFFFF) return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++)
  {
    const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len)
    {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) || (!mz_zip_reader_string_equal(pComment, pFile_comment, file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
    {
      int ofs = filename_len - 1;
      do
      {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs; filename_len -= ofs;
    }
    if ((filename_len == name_len) && (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}